

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_unset_property(Integer g_a)

{
  long lVar1;
  global_array_t *pgVar2;
  ushort uVar3;
  uint dev_flag;
  char **ppcVar4;
  int iVar5;
  Integer IVar6;
  logical lVar7;
  C_Integer *pCVar8;
  ushort uVar9;
  cache_struct_t *pcVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long bytes;
  ulong uVar14;
  cache_struct *pcVar15;
  bool bVar16;
  Integer status;
  Integer local_100;
  Integer local_f8;
  void *ptr;
  Integer hi [7];
  Integer lo [7];
  Integer ld [7];
  
  lVar1 = g_a + 1000;
  pgVar2 = GA + lVar1;
  if (GA[lVar1].property == 2) {
    pcVar10 = pgVar2->cache_head;
    pcVar15 = pcVar10;
    if (pcVar10 != (cache_struct_t *)0x0) {
      while( true ) {
        pcVar15 = pcVar15->next;
        free(pcVar10->cache_buf);
        free(GA[lVar1].cache_head);
        if (pcVar15 == (cache_struct *)0x0) break;
        GA[lVar1].cache_head = pcVar15;
        pcVar10 = GA[lVar1].cache_head;
      }
    }
    GA[lVar1].cache_head = (cache_struct_t *)0x0;
  }
  else if (GA[lVar1].property == 1) {
    uVar3 = pgVar2->ndim;
    IVar6 = pnga_create_handle();
    pnga_set_data(IVar6,(long)(short)uVar3,GA[lVar1].dims,(long)GA[lVar1].type);
    pnga_set_pgroup(IVar6,(long)GA[lVar1].old_handle);
    lVar7 = pnga_allocate(IVar6);
    if (lVar7 == 0) {
      pnga_error("Failed to allocate temporary array",0);
    }
    local_100 = pnga_pgroup_nodeid((long)GA[lVar1].old_handle);
    local_f8 = IVar6;
    pnga_distribution(IVar6,local_100,lo,hi);
    uVar9 = 0;
    if (0 < (short)uVar3) {
      uVar9 = uVar3;
    }
    uVar14 = (ulong)uVar9;
    bVar16 = true;
    for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
      ld[uVar11] = (hi[uVar11] - lo[uVar11]) + 1;
      if (hi[uVar11] < lo[uVar11]) {
        bVar16 = false;
      }
    }
    if (bVar16) {
      pnga_access_ptr(local_f8,lo,hi,&ptr,ld);
      pnga_get(g_a,lo,hi,ptr,ld);
    }
    pgVar2 = GA;
    lVar13 = (long)GA[lVar1].p_handle;
    ppcVar4 = GA[lVar1].ptr;
    if (lVar13 < 1) {
      IVar6 = pnga_pgroup_nodeid(lVar13);
      ARMCI_Free(ppcVar4[IVar6] + -pgVar2[lVar1].id);
    }
    else {
      IVar6 = pnga_pgroup_nodeid(lVar13);
      ARMCI_Free_group(ppcVar4[IVar6] + -pgVar2[lVar1].id,&PGRP_LIST[lVar13].group);
    }
    pgVar2 = GA;
    iVar12 = 0;
    for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
      iVar5 = pgVar2[g_a + 1000].old_nblock[uVar11];
      pgVar2[g_a + 1000].nblock[uVar11] = iVar5;
      pgVar2[g_a + 1000].lo[uVar11] = (long)pgVar2[g_a + 1000].old_lo[uVar11];
      pgVar2[g_a + 1000].chunk[uVar11] = (long)pgVar2[g_a + 1000].old_chunk[uVar11];
      iVar12 = iVar12 + iVar5;
    }
    free(GA[lVar1].mapc);
    pCVar8 = (C_Integer *)malloc((long)iVar12 * 8 + 8);
    GA[lVar1].mapc = pCVar8;
    pgVar2 = GA;
    for (lVar13 = 0; lVar13 <= iVar12; lVar13 = lVar13 + 1) {
      pgVar2[lVar1].mapc[lVar13] = pgVar2[lVar1].old_mapc[lVar13];
    }
    free(GA[lVar1].old_mapc);
    pnga_distribution(g_a,local_100,GA[lVar1].lo,hi);
    lVar13 = 1;
    bVar16 = true;
    for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
      if (hi[uVar11] < GA[g_a + 1000].lo[uVar11]) {
        bVar16 = false;
      }
      lVar13 = lVar13 * ((hi[uVar11] - GA[g_a + 1000].lo[uVar11]) + 1);
    }
    bytes = 0;
    if (bVar16) {
      bytes = lVar13 * GA[lVar1].elemsize;
    }
    if (GA_memory_limited == '\x01') {
      GAstat.curmem = GAstat.curmem - GA[lVar1].size;
      GA_total_memory = (GA_total_memory + GA[lVar1].size) - bytes;
      status = (ulong)~GA_total_memory >> 0x3f;
      iVar12 = GA[lVar1].old_handle;
      IVar6 = pnga_type_f2c(0x3f2);
      pnga_pgroup_gop((long)iVar12,IVar6,&status,1,"&&");
      bVar16 = status == 0;
    }
    else {
      GAstat.curmem = GAstat.curmem - GA[lVar1].size;
      status = 1;
      bVar16 = false;
    }
    pgVar2 = GA;
    iVar12 = GA[lVar1].p_handle;
    iVar5 = GA[lVar1].old_handle;
    GA[lVar1].p_handle = iVar5;
    if (bVar16) {
      pgVar2[lVar1].ptr[local_100] = (char *)0x0;
    }
    else {
      dev_flag = pgVar2[lVar1].mem_dev_set;
      if (dev_flag == 0) {
        iVar5 = gai_get_shmem(pgVar2[lVar1].ptr,bytes,pgVar2[lVar1].type,&pgVar2[lVar1].id,iVar5);
      }
      else {
        iVar5 = gai_get_devmem((char *)(ulong)dev_flag,pgVar2[lVar1].ptr,bytes,pgVar2[lVar1].type,
                               &pgVar2[lVar1].id,iVar5,dev_flag,pgVar2[lVar1].mem_dev);
      }
      status = (Integer)(iVar5 == 0);
    }
    GA[lVar1].size = bytes;
    if (status == 0) {
      pnga_error("Memory failure when setting READ_ONLY",0);
    }
    pnga_pgroup_destroy((long)iVar12);
    GA[lVar1].property = 0;
    pnga_distribution(g_a,GAme,lo,hi);
    IVar6 = local_f8;
    bVar16 = true;
    for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
      ld[uVar11] = (hi[uVar11] - lo[uVar11]) + 1;
      if (hi[uVar11] < lo[uVar11]) {
        bVar16 = false;
      }
    }
    if (bVar16) {
      pnga_access_ptr(g_a,lo,hi,&ptr,ld);
      pnga_get(IVar6,lo,hi,ptr,ld);
    }
    pnga_destroy(IVar6);
  }
  else {
    pgVar2->property = 0;
  }
  return;
}

Assistant:

void pnga_unset_property(Integer g_a) {
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].property == READ_ONLY) {
    /* TODO: Copy global array to original configuration */
    int i, d, ndim, btot, chk;
    Integer g_tmp, grp_me;
    Integer nprocs, nodeid, origin_id, dflt_grp, handle, maplen;
    Integer nelem, mem_size, status;
    Integer *list;
    Integer dims[MAXDIM], chunk[MAXDIM];
    Integer lo[MAXDIM], hi[MAXDIM], ld[MAXDIM];
    void *ptr, *buf;

    ndim = (int)GA[ga_handle].ndim;
    /* Start by making a copy of the GA */
    for (i=0; i<ndim; i++) {
      chunk[i] = GA[ga_handle].chunk[i];
      dims[i] = GA[ga_handle].dims[i];
    }
    /* Make a temporary copy of GA */
    g_tmp = pnga_create_handle();
    pnga_set_data(g_tmp,ndim,GA[ga_handle].dims,GA[ga_handle].type);
    pnga_set_pgroup(g_tmp,GA[ga_handle].old_handle);
    if (!pnga_allocate(g_tmp)) {
      pnga_error("Failed to allocate temporary array",0);
    }
    /* Copy portion of global array to locally held portion of tmp array */
    grp_me = pnga_pgroup_nodeid(GA[ga_handle].old_handle);
    pnga_distribution(g_tmp,grp_me,lo,hi);
    chk = 1;
    for (i=0; i<ndim; i++) {
      ld[i] = hi[i]-lo[i]+1;
      if (hi[i] < lo[i]) chk = 0;
    }
    if (chk) {
      pnga_access_ptr(g_tmp,lo,hi,&ptr,ld);
      pnga_get(g_a,lo,hi,ptr,ld);
    }

    /* Get rid of current memory allocation */
#ifndef AVOID_MA_STORAGE
    if(gai_uses_shm((int)GA[ga_handle].p_handle)){
#endif
      /* make sure that we free original (before address allignment)
       * pointer */
#ifdef MSG_COMMS_MPI
      if (GA[ga_handle].p_handle > 0){
        ARMCI_Free_group(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].p_handle)]
            - GA[ga_handle].id,
            &PGRP_LIST[GA[ga_handle].p_handle].group);
      }
      else
#endif
      {
        ARMCI_Free(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].p_handle)]
            - GA[ga_handle].id);
      }
#ifndef AVOID_MA_STORAGE
    }else{
      if(GA[ga_handle].id != INVALID_MA_HANDLE) MA_free_heap(GA[ga_handle].id);
    }
#endif
    
    /* Reset distribution parameters back to original values */
    btot = 0;
    for (i=0; i<ndim; i++) {
      GA[ga_handle].nblock[i] = GA[ga_handle].old_nblock[i];
      GA[ga_handle].lo[i] = GA[ga_handle].old_lo[i];
      GA[ga_handle].chunk[i] = GA[ga_handle].old_chunk[i];
      btot += GA[ga_handle].nblock[i];
    }
    free(GA[ga_handle].mapc);
    GA[ga_handle].mapc = (Integer*)malloc((btot+1)*sizeof(Integer));
    for (i=0; i<btot+1; i++) {
      GA[ga_handle].mapc[i] = GA[ga_handle].old_mapc[i];
    }
    free(GA[ga_handle].old_mapc);

    pnga_distribution(g_a, grp_me, GA[ga_handle].lo, hi);
    chk = 1;
    for( i = 0, nelem=1; i< ndim; i++){
      if (hi[i]-(Integer)GA[ga_handle].lo[i]+1 <= 0) chk = 0;
      nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1);
    }
    mem_size = nelem * GA[ga_handle].elemsize;
    if (!chk) mem_size = 0;

    if(GA_memory_limited) GA_total_memory += GA[ga_handle].size;
    GAstat.curmem -= GA[ga_handle].size;
    /* if requested, enforce limits on memory consumption */
    if(GA_memory_limited) GA_total_memory -= mem_size;
    /* check if everybody has enough memory left */
    if(GA_memory_limited){
      status = (GA_total_memory >= 0) ? 1 : 0;
      pnga_pgroup_gop(GA[ga_handle].old_handle,pnga_type_f2c(MT_F_INT),
          &status, 1, "&&");
    } else status = 1;
    handle = (Integer)GA[ga_handle].p_handle;
    GA[ga_handle].p_handle = GA[ga_handle].old_handle;
    if (status) {
      /* Allocate new memory */
      if (GA[ga_handle].mem_dev_set) {
        status = !gai_get_devmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, GA[ga_handle].p_handle,
            GA[ga_handle].mem_dev_set,GA[ga_handle].mem_dev);
      } else {
        status = !gai_getmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, GA[ga_handle].p_handle);
      }
    } else {
      GA[ga_handle].ptr[grp_me]=NULL;
    }
    GA[ga_handle].size = (C_Long)mem_size;
    if (!status) {
      pnga_error("Memory failure when setting READ_ONLY",0);
    }
    /* Get rid of read-only group */
    pnga_pgroup_destroy(handle);
    /* Generate parameters for new memory allocation. Distribution function
     * should work, so we can use that to find out how much data is on this
     * processor */
    GA[ga_handle].property = NO_PROPERTY;
    pnga_distribution(g_a,GAme,lo,hi);
    chk = 1;
    nelem = 1;
    for (i=0; i<ndim; i++) {
      ld[i] = hi[i]-lo[i]+1;
      nelem *= ld[i];
      if (hi[i] < lo[i]) chk = 0;
    }
    if (chk) {
#if 1
      pnga_access_ptr(g_a,lo,hi,&ptr,ld);
      pnga_get(g_tmp,lo,hi,ptr,ld);
#else
      /* MPI RMA does not allow you to use memory assigned to one window as
       * local buffer for another buffer. Create a local buffer to get around
       * this problem */
      buf = (void*)malloc(nelem*GA[ga_handle].elemsize);
      pnga_get(g_tmp,lo,hi,buf,ld);
      pnga_access_ptr(g_a,lo,hi,&ptr,ld);
      memcpy(ptr,buf,nelem*GA[ga_handle].elemsize);
      free(buf);
#endif
    }
    pnga_destroy(g_tmp);
  } else if (GA[ga_handle].property == READ_CACHE) {
    if (GA[ga_handle].cache_head != NULL) {
      cache_struct_t *next;
      next = GA[ga_handle].cache_head->next;
      if (GA[ga_handle].cache_head->cache_buf)
        free(GA[ga_handle].cache_head->cache_buf);
      free(GA[ga_handle].cache_head);
      while (next) {
        GA[ga_handle].cache_head = next;
        next = next->next;
        if (GA[ga_handle].cache_head->cache_buf)
          free(GA[ga_handle].cache_head->cache_buf);
        free(GA[ga_handle].cache_head);
      }
    }
    GA[ga_handle].cache_head = NULL;
  } else {
    GA[ga_handle].property = NO_PROPERTY;
  }
}